

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

Object * executeStatement(Object *__return_storage_ptr__,Statement s,Environment *env)

{
  ExpressionType EVar1;
  Expression *id;
  Expression *init;
  char *identifer;
  Call c;
  Object value;
  Object value_00;
  Object o_00;
  Object *pOVar2;
  anon_union_8_4_50a03f35_for_Literal_2 aVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  char *ide;
  long lVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  Literal LVar22;
  Block b;
  Object o;
  Object o_1;
  Object o_2;
  undefined8 in_stack_fffffffffffffef8;
  Object local_f8;
  undefined4 local_b0;
  undefined4 uStack_ac;
  Literal LStack_a8;
  int iStack_98;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  int iStack_88;
  BlockType BStack_84;
  int local_80;
  BlockType BStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  Literal LStack_68;
  int iStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  int iStack_48;
  BlockType BStack_44;
  int local_40;
  BlockType BStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  uVar4 = s.field_1._0_8_;
  switch(s.type) {
  case STATEMENT_SET:
    if (0 < s.field_1.printStatement.argCount) {
      lVar7 = 0;
      do {
        id = *(Expression **)((long)&(s.field_1.blockStatement.statements)->type + lVar7);
        init = *(Expression **)((long)&(s.field_1.blockStatement.statements)->field_1 + lVar7);
        EVar1 = id->type;
        if (EVar1 == EXPR_REFERENCE) {
          write_ref(id,init,env,env,s.field_1.blockStatement.numStatements);
        }
        else if (EVar1 == EXPR_ARRAY) {
          write_array(id,init,env,env,s.field_1.blockStatement.numStatements);
        }
        else {
          if (EVar1 != EXPR_VARIABLE) {
            pcVar6 = "\x1b[31m\n[Runtime Error] [Line:%d] Bad assignment target!\x1b[0m";
LAB_00105523:
            uVar4 = uVar4 & 0xffffffff;
            goto LAB_00105526;
          }
          pcVar6 = (id->field_1).variable.name;
          resolveExpression(&local_f8,init,env);
          value.field_1.instance = local_f8.field_1.instance;
          value.type = local_f8.type;
          value._4_4_ = local_f8._4_4_;
          value.field_1._8_4_ = local_f8.field_1.literal.field_2._0_4_;
          value.field_1._12_4_ = local_f8.field_1.literal.field_2._4_4_;
          value.field_1.routine.arity = (int)local_f8.field_1._16_8_;
          value.field_1._20_4_ = (int)((ulong)local_f8.field_1._16_8_ >> 0x20);
          value.field_1._24_4_ = (int)local_f8.field_1.routine.arguments;
          value.field_1._28_4_ = (int)((ulong)local_f8.field_1._24_8_ >> 0x20);
          value.field_1.container.constructor.numStatements = (int)local_f8.field_1._32_8_;
          value.field_1.container.constructor.blockName =
               (int)((ulong)local_f8.field_1._32_8_ >> 0x20);
          value.field_1.routine.code.numStatements =
               (int)local_f8.field_1.container.constructor.statements;
          value.field_1.routine.code.blockName = (int)((ulong)local_f8.field_1._40_8_ >> 0x20);
          value.field_1._48_4_ = (int)local_f8.field_1.routine.code.statements;
          value.field_1._52_4_ = (int)((ulong)local_f8.field_1._48_8_ >> 0x20);
          env_put(pcVar6,s.field_1.blockStatement.numStatements,value,env);
        }
        lVar7 = lVar7 + 0x10;
      } while ((uVar4 >> 0x20) * 0x10 != lVar7);
    }
    goto LAB_0010549a;
  case STATEMENT_ARRAY:
    if (0 < s.field_1.printStatement.argCount) {
      uVar8 = 0;
      do {
        lVar7 = *(long *)(&(s.field_1.blockStatement.statements)->type + uVar8 * 2);
        LVar22 = resolveLiteral(*(Expression **)(lVar7 + 0x10),
                                s.field_1.blockStatement.numStatements,env);
        if ((LVar22._0_8_ & 0xffffffff00000000) != 0x100000000) {
          pcVar6 = "\x1b[31m\n[Runtime Error] [Line:%d] Array dimension must be an integer!\x1b[0m";
          goto LAB_00105523;
        }
        env_arr_new(*(char **)(lVar7 + 0x18),s.field_1.blockStatement.numStatements,
                    LVar22.field_2.iVal,env);
        uVar8 = uVar8 + 1;
      } while (uVar4 >> 0x20 != uVar8);
    }
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
    (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
    __return_storage_ptr__->type = OBJECT_NULL;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
    return __return_storage_ptr__;
  case STATEMENT_INPUT:
    if (0 < s.field_1.printStatement.argCount) {
      lVar7 = 0;
      do {
        iVar5 = *(int *)((long)&(s.field_1.blockStatement.statements)->type + lVar7);
        pcVar6 = *(char **)((long)&(s.field_1.blockStatement.statements)->field_1 + lVar7);
        if (iVar5 == 1) {
          identifer = *(char **)((long)&(s.field_1.blockStatement.statements)->field_1 + lVar7 + 8);
          iVar5 = (int)pcVar6;
          if (iVar5 == 2) {
            LStack_68 = getFloat(s.field_1.blockStatement.numStatements);
            local_70 = 1;
            uVar8 = CONCAT44(uStack_6c,1);
            uVar10 = LStack_68.field_2._0_4_;
            uVar11 = LStack_68.field_2._4_4_;
            uVar12 = iStack_58;
            uVar13 = uStack_54;
            uVar14 = local_50;
            uVar15 = uStack_4c;
            uVar16 = iStack_48;
            uVar17 = BStack_44;
            uVar18 = local_40;
            uVar19 = BStack_3c;
            uVar20 = uStack_38;
            uVar21 = uStack_34;
            uVar9 = LStack_68._0_8_;
          }
          else if (iVar5 == 1) {
            LStack_a8 = getInt(s.field_1.blockStatement.numStatements);
            local_b0 = 1;
            uVar8 = CONCAT44(uStack_ac,1);
            uVar10 = LStack_a8.field_2._0_4_;
            uVar11 = LStack_a8.field_2._4_4_;
            uVar12 = iStack_98;
            uVar13 = uStack_94;
            uVar14 = local_90;
            uVar15 = uStack_8c;
            uVar16 = iStack_88;
            uVar17 = BStack_84;
            uVar18 = local_80;
            uVar19 = BStack_7c;
            uVar20 = uStack_78;
            uVar21 = uStack_74;
            uVar9 = LStack_a8._0_8_;
          }
          else {
            if (iVar5 != 0) goto LAB_0010521f;
            local_f8.field_1.literal = getString(s.field_1.blockStatement.numStatements);
            local_f8.type = 1;
            uVar10 = local_f8.field_1._8_4_;
            uVar11 = local_f8.field_1._12_4_;
            uVar12 = local_f8.field_1.routine.arity;
            uVar13 = local_f8.field_1._20_4_;
            uVar14 = local_f8.field_1._24_4_;
            uVar15 = local_f8.field_1._28_4_;
            uVar16 = local_f8.field_1.container.constructor.numStatements;
            uVar17 = local_f8.field_1.container.constructor.blockName;
            uVar18 = local_f8.field_1.routine.code.numStatements;
            uVar19 = local_f8.field_1.routine.code.blockName;
            uVar20 = local_f8.field_1._48_4_;
            uVar21 = local_f8.field_1._52_4_;
            uVar8 = local_f8._0_8_;
            uVar9 = local_f8.field_1.instance;
          }
          value_00.field_1.instance = (Instance *)uVar9;
          value_00._0_8_ = uVar8;
          value_00.field_1._8_4_ = uVar10;
          value_00.field_1._12_4_ = uVar11;
          value_00.field_1.routine.arity = uVar12;
          value_00.field_1._20_4_ = uVar13;
          value_00.field_1._24_4_ = uVar14;
          value_00.field_1._28_4_ = uVar15;
          value_00.field_1.container.constructor.numStatements = uVar16;
          value_00.field_1.container.constructor.blockName = uVar17;
          value_00.field_1.routine.code.numStatements = uVar18;
          value_00.field_1.routine.code.blockName = uVar19;
          value_00.field_1._48_4_ = uVar20;
          value_00.field_1._52_4_ = uVar21;
          env_put(identifer,s.field_1.blockStatement.numStatements,value_00,env);
        }
        else if (iVar5 == 0) {
          printString(pcVar6);
        }
LAB_0010521f:
        lVar7 = lVar7 + 0x18;
      } while ((uVar4 >> 0x20) * 0x18 != lVar7);
    }
    break;
  case STATEMENT_IF:
    LVar22 = resolveLiteral(s.field_1.ifStatement.condition,s.field_1.blockStatement.numStatements,
                            env);
    if (LVar22.type == LIT_LOGICAL) {
      if (LVar22.field_2._0_4_ != 0) {
        s.field_1.ifStatement.elseBranch.statements = s.field_1.ifStatement.thenBranch.statements;
        s.field_1._32_8_ = s.field_1.breakStatement.pos.file;
      }
      b.statements = s.field_1.ifStatement.elseBranch.statements;
      b._0_8_ = s.field_1._32_8_;
      executeBlock(__return_storage_ptr__,b,env);
      return __return_storage_ptr__;
    }
LAB_00105548:
    pcVar6 = "\x1b[31m\n[Runtime Error] [Line:%d] Not a logical expression as condition!\x1b[0m";
LAB_0010555f:
    uVar4 = (ulong)s.field_1.breakStatement.pos.type;
LAB_00105526:
    printf(pcVar6,uVar4);
    putchar(10);
    unload_all();
    exit(1);
  case STATEMENT_WHILE:
    LVar22 = resolveLiteral(s.field_1.ifStatement.condition,s.field_1.blockStatement.numStatements,
                            env);
    aVar3 = LVar22.field_2;
    if (LVar22.type != LIT_LOGICAL) goto LAB_00105548;
    local_f8.field_1.container.constructor.statements = (Statement *)0;
    local_f8.field_1.routine.code.statements = (Statement *)0;
    local_f8.field_1.routine.arguments = (char **)0;
    local_f8.field_1._32_8_ = 0;
    local_f8.field_1._16_8_ = 0;
    local_f8.type = OBJECT_NULL;
    local_f8._4_4_ = 0;
    local_f8.field_1.literal = (Literal)ZEXT816((ulong)0x400000000);
    while (aVar3.lVal != 0) {
      executeBlock(&local_f8,s.field_1._16_16_,env);
      if (brk == '\x01') {
        brk = '\0';
        break;
      }
      if (ret == '\x01') {
        *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x28) =
             local_f8.field_1.container.constructor.statements;
        *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x30) =
             local_f8.field_1.routine.code.statements;
        (__return_storage_ptr__->field_1).routine.arguments = local_f8.field_1.routine.arguments;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_f8.field_1._32_8_;
        (__return_storage_ptr__->field_1).literal.field_2.iVal =
             (long)local_f8.field_1.literal.field_2;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_f8.field_1._16_8_;
        goto LAB_001054bb;
      }
      LVar22 = resolveLiteral(s.field_1.ifStatement.condition,s.field_1.blockStatement.numStatements
                              ,env);
      aVar3 = LVar22.field_2;
    }
    break;
  case STATEMENT_BREAK:
    brk = '\x01';
    break;
  case STATEMENT_PRINT:
    if (0 < s.field_1.printStatement.argCount) {
      uVar8 = 0;
      do {
        resolveExpression(&local_f8,
                          *(Expression **)(&(s.field_1.blockStatement.statements)->type + uVar8 * 2)
                          ,env);
        aVar3 = local_f8.field_1.literal.field_2;
        switch(local_f8._0_8_ & 0xffffffff) {
        case 0:
          printf("Null",local_f8.field_1.arr.values);
          break;
        case 1:
          if (local_f8.field_1.literal.type < (LIT_NULL|LIT_INT)) {
            pOVar2 = (Object *)
                     (*(code *)(&DAT_00108bc0 +
                               *(int *)(&DAT_00108bc0 +
                                       ((ulong)local_f8.field_1.instance >> 0x20) * 4)))();
            return pOVar2;
          }
          break;
        case 2:
          printf("<array of %d>",(ulong)local_f8.field_1.instance & 0xffffffff);
          break;
        case 3:
          pcVar6 = "<routine %s>";
          goto LAB_00105394;
        case 4:
          pcVar6 = "<container %s>";
          goto LAB_00105394;
        case 5:
          pcVar6 = "<instance of container %s>";
          aVar3.sVal = (local_f8.field_1.instance)->name;
LAB_00105394:
          printf(pcVar6,aVar3.iVal);
        }
        uVar8 = uVar8 + 1;
      } while (uVar4 >> 0x20 != uVar8);
    }
    break;
  case STATEMENT_ROUTINE:
    env_routine_put(s.field_1.routine,s.field_1.blockStatement.numStatements,globalEnv);
    break;
  case STATEMENT_CALL:
    if ((s.field_1.blockStatement.statements)->type != STATEMENT_BREAK) {
      pcVar6 = "\x1b[31m\n[Runtime Error] [Line:%d] Expected call expression!\x1b[0m";
      goto LAB_0010555f;
    }
    uVar9 = *(undefined8 *)((long)&(s.field_1.blockStatement.statements)->field_1 + 0x18);
    c._20_4_ = (int)((ulong)*(undefined8 *)
                             ((long)&(s.field_1.blockStatement.statements)->field_1 + 0x10) >> 0x20)
    ;
    c._0_20_ = *(undefined1 (*) [20])&(s.field_1.blockStatement.statements)->field_1;
    c.arguments._0_4_ = (int)uVar9;
    c.arguments._4_4_ = (int)((ulong)uVar9 >> 0x20);
    resolveCall(&local_f8,c,env);
    if (local_f8.type != OBJECT_NULL) {
      printf("\x1b[33m\n[Warning] [Line %d] Ignoring return value!\x1b[0m",
             (ulong)s.field_1.breakStatement.pos.type);
    }
    if (local_f8.type == OBJECT_INSTANCE) {
      o_00.field_1._8_4_ = (int)local_f8.field_1._16_8_;
      o_00._0_16_ = local_f8.field_1.literal;
      o_00.field_1._12_4_ = (int)((ulong)local_f8.field_1._16_8_ >> 0x20);
      o_00.field_1.routine.arity = (int)local_f8.field_1.routine.arguments;
      o_00.field_1._20_4_ = (int)((ulong)local_f8.field_1._24_8_ >> 0x20);
      o_00.field_1._24_4_ = (int)local_f8.field_1._32_8_;
      o_00.field_1._28_4_ = (int)((ulong)local_f8.field_1._32_8_ >> 0x20);
      o_00.field_1.container.constructor.numStatements =
           (int)local_f8.field_1.container.constructor.statements;
      o_00.field_1.container.constructor.blockName = (int)((ulong)local_f8.field_1._40_8_ >> 0x20);
      o_00.field_1.routine.code.numStatements = (int)local_f8.field_1.routine.code.statements;
      o_00.field_1.routine.code.blockName = (int)((ulong)local_f8.field_1._48_8_ >> 0x20);
      o_00.field_1.routine.code.statements = (Statement *)in_stack_fffffffffffffef8;
      gc_obj(o_00);
    }
    break;
  case STATEMENT_RETURN:
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
    (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
    __return_storage_ptr__->type = OBJECT_NULL;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
    if (s.field_1.blockStatement.statements != (Statement *)0x0) {
      resolveExpression(__return_storage_ptr__,s.field_1.ifStatement.condition,env);
    }
    if (__return_storage_ptr__->type == OBJECT_INSTANCE) {
      ((__return_storage_ptr__->field_1).instance)->fromReturn = 1;
    }
    ret = 1;
    return __return_storage_ptr__;
  case STATEMENT_CONTAINER:
    env_container_put(s.field_1._0_48_,s.field_1.blockStatement.numStatements,globalEnv);
    break;
  case STATEMENT_END:
    exit(0);
  }
LAB_0010549a:
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
  (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
  local_f8.type = OBJECT_NULL;
  local_f8._4_4_ = 0;
  local_f8.field_1.instance = (Instance *)0x400000000;
LAB_001054bb:
  __return_storage_ptr__->type = local_f8.type;
  *(int *)&__return_storage_ptr__->field_0x4 = local_f8._4_4_;
  (__return_storage_ptr__->field_1).instance = local_f8.field_1.instance;
  return __return_storage_ptr__;
}

Assistant:

static Object executeStatement(Statement s, Environment *env){
    switch(s.type){
        case STATEMENT_PRINT:
            return executePrint(s.printStatement, env);
        case STATEMENT_IF:
            return executeIf(s.ifStatement, env);
        case STATEMENT_WHILE:
            return executeWhile(s.whileStatement, env);
        case STATEMENT_SET:
            return executeSet(s.setStatement, env);
        case STATEMENT_ARRAY:
            return executeArray(s.arrayStatement, env);
        case STATEMENT_INPUT:
            return executeInput(s.inputStatement, env);
        case STATEMENT_BREAK:
            return executeBreak();
        case STATEMENT_END:
            return executeEnd();
        case STATEMENT_BEGIN:
            return executeBegin();
            //       case STATEMENT_DO:
            //           executeDo(s.)
        case STATEMENT_ROUTINE:
            return registerRoutine(s.routine);
        case STATEMENT_CONTAINER:
            return registerContainer(s.container);
        case STATEMENT_CALL:
            return executeCall(s.callStatement, env);
        case STATEMENT_NOOP:
            break;
        case STATEMENT_RETURN:
            return executeReturn(s.returnStatement, env);
        default:
            break;
    }
    return nullObject;
}